

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

string * __thiscall
deqp::gls::DrawTestSpec::getMultilineDesc_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  pointer pAVar9;
  bool bVar10;
  stringstream desc;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  allocator<char> local_1e1;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pAVar9 = (this->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->attribs).
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar9) {
    lVar6 = 0x25;
    uVar8 = 0;
    do {
      if (*(char *)((long)pAVar9 + lVar6 + -1) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Attribute ",10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": default, ",0xb);
        bVar1 = *(byte *)((long)&pAVar9->inputType + lVar6);
        pcVar7 = "color\n";
        if (uVar8 == 0 || (bVar1 & 1) != 0) {
          pcVar7 = "position\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,pcVar7,(ulong)((uVar8 == 0 | bVar1) & 1) * 3 + 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinput datatype ",0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   inputTypeToString::types[*(int *)((long)pAVar9 + lVar6 + -0x25)],
                   (allocator<char> *)&local_228);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinput component count ",0x17);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar6 + -0x15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tused as ",9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,
                   outputTypeToString::types[*(int *)((long)pAVar9 + lVar6 + -0x21)],
                   (allocator<char> *)&local_1e0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Attribute ",10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        bVar1 = *(byte *)((long)&pAVar9->inputType + lVar6);
        pcVar7 = "color\n";
        if (uVar8 == 0 || (bVar1 & 1) != 0) {
          pcVar7 = "position\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,pcVar7,(ulong)((uVar8 == 0 | bVar1) & 1) * 3 + 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tStorage in ",0xc);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   storageToString::storages[*(int *)((long)pAVar9 + lVar6 + -0x1d)],
                   (allocator<char> *)&local_228);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tstride ",8);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar6 + -0xd));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinput datatype ",0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,
                   inputTypeToString::types[*(int *)((long)pAVar9 + lVar6 + -0x25)],
                   (allocator<char> *)&local_1e0);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_228,local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinput component count ",0x17);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar6 + -0x15));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        bVar10 = *(char *)((long)pAVar9 + lVar6 + -9) != '\0';
        pcVar7 = "";
        if (bVar10) {
          pcVar7 = "\tnormalized\n";
        }
        lVar5 = 0;
        if (bVar10) {
          lVar5 = 0xc;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tused as ",9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,
                   outputTypeToString::types[*(int *)((long)pAVar9 + lVar6 + -0x21)],&local_1e1);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_1e0,local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance divisor ",0x12);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)pAVar9 + lVar6 + -5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      uVar8 = uVar8 + 1;
      pAVar9 = (this->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
    } while (uVar8 < (ulong)(((long)(this->attribs).
                                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar9 >> 3)
                            * -0x3333333333333333));
  }
  psVar2 = local_1c0;
  switch(this->drawMethod) {
  case DRAWMETHOD_DRAWARRAYS:
    poVar3 = local_1a8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"drawArrays()\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tfirst ",7);
    piVar4 = &this->first;
    goto LAB_00967d65;
  case DRAWMETHOD_DRAWARRAYS_INSTANCED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawArraysInstanced()\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tfirst ",7);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance count ",0x10);
    piVar4 = &this->instanceCount;
    goto LAB_00967d65;
  case DRAWMETHOD_DRAWARRAYS_INDIRECT:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawArraysIndirect()\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tfirst ",7);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance count ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindirect offset ",0x11);
    piVar4 = &this->indirectOffset;
LAB_00967d65:
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    goto switchD_00967637_default;
  case DRAWMETHOD_DRAWELEMENTS:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElements()\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsRanged()\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\trange start ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\trange end ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsInstanced()\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance count ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_INDIRECT:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsIndirect()\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance count ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindirect offset ",0x11);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indirectOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbase vertex ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"drawElementsBaseVertex()\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbase vertex ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"drawElementsInstancedBaseVertex()\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tinstance count ",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbase vertex ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  case DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"drawRangeElementsBaseVertex()\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tindex type ",0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,indexTypeToString::indexTypes[(int)this->indexType],
               (allocator<char> *)&local_228);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex storage in ",0x12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,storageToString::storages[(int)this->indexStorage],
               (allocator<char> *)&local_1e0);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tindex offset ",0xe);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tbase vertex ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->baseVertex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\trange start ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\trange end ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->indexMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    break;
  default:
    goto switchD_00967637_default;
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
switchD_00967637_default:
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t",1);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a8,this->primitiveCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  uVar8 = (ulong)this->primitive;
  if (uVar8 < 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)(&DAT_00d56230 + uVar8 * 8),*(long *)(&DAT_00b864d0 + uVar8 * 8))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string DrawTestSpec::getMultilineDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attrib.useDefaultAttribute)
		{
			desc
				<< "Attribute " << ndx << ": default, " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n";
		}
		else
		{
			desc
				<< "Attribute " << ndx << ": " << ((ndx == 0|| attrib.additionalPositionAttribute) ? ("position\n") : ("color\n"))
				<< "\tStorage in " << DrawTestSpec::storageToString(attrib.storage) << "\n"
				<< "\tstride " << attrib.stride << "\n"
				<< "\tinput datatype " << DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "\n"
				<< "\tinput component count " << attrib.componentCount << "\n"
				<< (attrib.normalize ? "\tnormalized\n" : "")
				<< "\tused as " << DrawTestSpec::outputTypeToString(attrib.outputType) << "\n"
				<< "\tinstance divisor " << attrib.instanceDivisor << "\n";
		}
	}

	if (drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		desc
			<< "drawArrays()\n"
			<< "\tfirst " << first << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INSTANCED)
	{
		desc
			<< "drawArraysInstanced()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		desc
			<< "drawElements()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED)
	{
		desc
			<< "drawElementsRanged()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED)
	{
		desc
			<< "drawElementsInstanced()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWARRAYS_INDIRECT)
	{
		desc
			<< "drawArraysIndirect()\n"
			<< "\tfirst " << first << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		desc
			<< "drawElementsIndirect()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tindirect offset " << indirectOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
	{
		desc
			<< "drawElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX)
	{
		desc
			<< "drawElementsInstancedBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tinstance count " << instanceCount << "\n"
			<< "\tbase vertex " << baseVertex << "\n";
	}
	else if (drawMethod == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
	{
		desc
			<< "drawRangeElementsBaseVertex()\n"
			<< "\tindex type " << DrawTestSpec::indexTypeToString(indexType) << "\n"
			<< "\tindex storage in " << DrawTestSpec::storageToString(indexStorage) << "\n"
			<< "\tindex offset " << indexPointerOffset << "\n"
			<< "\tbase vertex " << baseVertex << "\n"
			<< "\trange start " << indexMin << "\n"
			<< "\trange end " << indexMax << "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	desc << "\t" << primitiveCount << " ";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			desc << "points";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			desc << "triangles";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			desc << "triangles (fan)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			desc << "triangles (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			desc << "lines";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			desc << "lines (strip)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			desc << "lines (loop)";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			desc << "lines (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			desc << "lines (strip, adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			desc << "triangles (adjancency)";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			desc << "triangles (strip, adjancency)";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	desc << "\n";

	return desc.str();
}